

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubgraphNode.h
# Opt level: O0

void __thiscall
dg::SubgraphNode<dg::pta::PSNode>::addUser(SubgraphNode<dg::pta::PSNode> *this,PSNode *nd)

{
  bool bVar1;
  iterator this_00;
  iterator __x;
  reference ppPVar2;
  PSNode *in_RSI;
  vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *in_RDI;
  PSNode *u;
  iterator __end0;
  iterator __begin0;
  NodesVec *__range2;
  PSNode *in_stack_ffffffffffffffd0;
  
  this_00 = std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::begin(in_RDI);
  __x = std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::end(in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<dg::pta::PSNode_**,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
                        *)in_stack_ffffffffffffffd0,
                       (__normal_iterator<dg::pta::PSNode_**,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
                        *)in_RDI);
    if (!bVar1) {
      std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::push_back
                ((vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *)this_00._M_current
                 ,__x._M_current);
      return;
    }
    ppPVar2 = __gnu_cxx::
              __normal_iterator<dg::pta::PSNode_**,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
              ::operator*((__normal_iterator<dg::pta::PSNode_**,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
                           *)&stack0xffffffffffffffe0);
    in_stack_ffffffffffffffd0 = *ppPVar2;
    if (in_stack_ffffffffffffffd0 == in_RSI) break;
    __gnu_cxx::
    __normal_iterator<dg::pta::PSNode_**,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
    ::operator++((__normal_iterator<dg::pta::PSNode_**,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
                  *)&stack0xffffffffffffffe0);
  }
  return;
}

Assistant:

void addUser(NodeT *nd) {
        // do not add duplicate users
        for (auto *u : users)
            if (u == nd)
                return;

        users.push_back(nd);
    }